

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  size_t sVar2;
  type pcVar3;
  size_t sVar4;
  size_t __len;
  size_t __n;
  char __tmp;
  char *__src;
  size_t __len_1;
  ulong uVar5;
  ptrdiff_t _Num_2;
  type __dest;
  
  uVar5 = (ulong)spec->width_;
  sVar4 = f->size_;
  __n = uVar5 - sVar4;
  if (uVar5 < sVar4 || __n == 0) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,sVar4);
    sVar4 = f->size_;
    if (sVar4 == 0) {
      return;
    }
    __src = f->s;
LAB_00114d85:
    memmove(pcVar3,__src,sVar4);
    return;
  }
  pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar5);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar5 = __n >> 1;
    __dest = pcVar3;
    if (1 < __n) {
      __dest = pcVar3 + uVar5;
      memset(pcVar3,(uint)bVar1,uVar5);
    }
    sVar2 = f->size_;
    if (sVar2 != 0) {
      memmove(__dest,f->s,sVar2);
    }
    __n = __n - uVar5;
    pcVar3 = __dest + sVar2;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(pcVar3,(uint)bVar1,__n);
      sVar4 = f->size_;
      if (sVar4 == 0) {
        return;
      }
      pcVar3 = pcVar3 + __n;
      __src = f->s;
      goto LAB_00114d85;
    }
    sVar2 = f->size_;
    if (sVar2 != 0) {
      memmove(pcVar3,f->s,sVar2);
    }
    pcVar3 = pcVar3 + sVar2;
  }
  memset(pcVar3,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }